

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteInMemory(char *zFilename)

{
  sxu32 sVar1;
  sxi32 sVar2;
  sxu32 n;
  char *zFilename_local;
  
  if ((zFilename == (char *)0x0) || (*zFilename == '\0')) {
    zFilename_local._4_4_ = 1;
  }
  else {
    sVar1 = SyStrlen(zFilename);
    if ((sVar1 == 5) && (sVar2 = SyStrnicmp(zFilename,":mem:",5), sVar2 == 0)) {
      return 1;
    }
    if ((sVar1 == 8) && (sVar2 = SyStrnicmp(zFilename,":memory:",8), sVar2 == 0)) {
      return 1;
    }
    zFilename_local._4_4_ = 0;
  }
  return zFilename_local._4_4_;
}

Assistant:

static int unqliteInMemory(const char *zFilename)
{
	sxu32 n;
	if( SX_EMPTY_STR(zFilename) ){
		/* NULL or the empty string means an in-memory database */
		return TRUE;
	}
	n = SyStrlen(zFilename);
	if( n == sizeof(":mem:") - 1 && 
		SyStrnicmp(zFilename,":mem:",sizeof(":mem:") - 1) == 0 ){
			return TRUE;
	}
	if( n == sizeof(":memory:") - 1 && 
		SyStrnicmp(zFilename,":memory:",sizeof(":memory:") - 1) == 0 ){
			return TRUE;
	}
	return FALSE;
}